

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wln_Ntk_t *pNtk_00;
  int *piVar1;
  char *pcVar2;
  Wln_Ntk_t *pNtk;
  Vec_Int_t *vMoves;
  int fVerbose;
  int fDump;
  int c;
  int fSkipSimple;
  char *pFileName;
  FILE *pFile;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _c = (char *)0x0;
  fDump = 0;
  vMoves._4_4_ = 0;
  vMoves._0_4_ = 0;
  pFile = (FILE *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_003e7807:
  fVerbose = Extra_UtilGetopt(argv_local._4_4_,(char **)pFile,"sdvh");
  if (fVerbose == -1) {
    if (pAStack_18->pNdr == (void *)0x0) {
      if (argv_local._4_4_ == globalUtilOptind + 1) {
        _c = *(char **)(&pFile->_flags + (long)globalUtilOptind * 2);
        pFileName = (char *)fopen(_c,"r");
        if ((FILE *)pFileName == (FILE *)0x0) {
          Abc_Print(1,"Cannot open input file \"%s\". ",_c);
          _c = Extra_FileGetSimilarName(_c,".ndr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
          if (_c != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",_c);
          }
          Abc_Print(1,"\n");
        }
        else {
          fclose((FILE *)pFileName);
          Wln_NtkRetimeTest(_c,fDump,vMoves._4_4_,(uint)vMoves);
        }
      }
      else {
        printf("Abc_CommandRetime(): Input file name should be given on the command line.\n");
      }
    }
    else {
      pNtk_00 = Wln_NtkFromNdr(pAStack_18->pNdr,vMoves._4_4_);
      Wln_NtkRetimeCreateDelayInfo(pNtk_00);
      if (pNtk_00 == (Wln_Ntk_t *)0x0) {
        printf("Transforming NDR into internal represnetation has failed.\n");
      }
      else {
        pNtk = (Wln_Ntk_t *)Wln_NtkRetime(pNtk_00,fDump,(uint)vMoves);
        Wln_NtkFree(pNtk_00);
        if (pAStack_18->pNdrArray != (int *)0x0) {
          free(pAStack_18->pNdrArray);
          pAStack_18->pNdrArray = (int *)0x0;
        }
        if (pNtk != (Wln_Ntk_t *)0x0) {
          piVar1 = Vec_IntReleaseNewArray((Vec_Int_t *)pNtk);
          pAStack_18->pNdrArray = piVar1;
        }
        Vec_IntFreeP((Vec_Int_t **)&pNtk);
      }
    }
    return 0;
  }
  switch(fVerbose) {
  case 100:
    vMoves._4_4_ = vMoves._4_4_ ^ 1;
    goto LAB_003e7807;
  default:
    break;
  case 0x68:
    break;
  case 0x73:
    fDump = fDump ^ 1;
    goto LAB_003e7807;
  case 0x76:
    goto switchD_003e7845_caseD_76;
  }
  Abc_Print(-2,"usage: %%retime [-sdvh]\n");
  Abc_Print(-2,"\t         performs retiming for the NDR design\n");
  pcVar2 = "no";
  if (fDump == 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-s     : toggle printing simple nodes [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (vMoves._4_4_ != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-d     : toggle dumping the network in Verilog [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if ((uint)vMoves != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_003e7845_caseD_76:
  vMoves._0_4_ = (uint)vMoves ^ 1;
  goto LAB_003e7807;
}

Assistant:

int Abc_CommandRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nMaxIters;
    int fForward;
    int fBackward;
    int fOneStep;
    int fUseOldNames;
    int fVerbose;
    int Mode;
    int nDelayLim;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Mode      =  5;
    nDelayLim =  0;
    fForward  =  0;
    fBackward =  0;
    fOneStep  =  0;
    fUseOldNames = 0;
    fVerbose  =  0;
    nMaxIters = 15;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MDfbsovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            Mode = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Mode < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nDelayLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDelayLim < 0 )
                goto usage;
            break;
        case 'f':
            fForward ^= 1;
            break;
        case 'b':
            fBackward ^= 1;
            break;
        case 's':
            fOneStep ^= 1;
            break;
        case 'o':
            fUseOldNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fForward && fBackward )
    {
        Abc_Print( -1, "Only one switch \"-f\" or \"-b\" can be selected at a time.\n" );
        return 1;
    }

    if ( !Abc_NtkLatchNum(pNtk) )
    {
//        Abc_Print( -1, "The network has no latches. Retiming is not performed.\n" );
        return 0;
    }

    if ( Mode < 0 || Mode > 6 )
    {
        Abc_Print( -1, "The mode (%d) is incorrect. Retiming is not performed.\n", Mode );
        return 0;
    }

    if ( Abc_NtkIsStrash(pNtk) )
    {
        if ( Abc_NtkGetChoiceNum(pNtk) )
        {
            Abc_Print( -1, "Retiming with choice nodes is not implemented.\n" );
            return 0;
        }
        // convert the network into an SOP network
        pNtkRes = Abc_NtkToLogic( pNtk );
        // perform the retiming
        Abc_NtkRetime( pNtkRes, Mode, nDelayLim, fForward, fBackward, fOneStep, fUseOldNames, fVerbose );
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        return 0;
    }

    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        Abc_Print( -1, "Converting to SOPs has failed.\n" );
        return 0;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The network is not a logic network. Retiming is not performed.\n" );
        return 0;
    }

    // perform the retiming
    Abc_NtkRetime( pNtk, Mode, nDelayLim, fForward, fBackward, fOneStep, fUseOldNames, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: retime [-MD num] [-fbsovh]\n" );
    Abc_Print( -2, "\t         retimes the current network using one of the algorithms:\n" );
    Abc_Print( -2, "\t             1: most forward retiming\n" );
    Abc_Print( -2, "\t             2: most backward retiming\n" );
    Abc_Print( -2, "\t             3: forward and backward min-area retiming\n" );
    Abc_Print( -2, "\t             4: forward and backward min-delay retiming\n" );
    Abc_Print( -2, "\t             5: mode 3 followed by mode 4\n" );
    Abc_Print( -2, "\t             6: Pan's optimum-delay retiming using binary search\n" );
    Abc_Print( -2, "\t-M num : the retiming algorithm to use [default = %d]\n", Mode );
    Abc_Print( -2, "\t-D num : the minimum delay target (0=unused) [default = %d]\n", nDelayLim );
    Abc_Print( -2, "\t-f     : enables forward-only retiming in modes 3,4,5 [default = %s]\n", fForward? "yes": "no" );
    Abc_Print( -2, "\t-b     : enables backward-only retiming in modes 3,4,5 [default = %s]\n", fBackward? "yes": "no" );
    Abc_Print( -2, "\t-s     : enables retiming one step only in mode 4 [default = %s]\n", fOneStep? "yes": "no" );
    Abc_Print( -2, "\t-o     : enables usind old flop naming conventions [default = %s]\n", fUseOldNames? "yes": "no" );
    Abc_Print( -2, "\t-v     : enables verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
//    Abc_Print( -2, "\t-I num : max number of iterations of l-value computation [default = %d]\n", nMaxIters );
//    Abc_Print( -2, "\t-f     : toggle forward retiming (for AIGs) [default = %s]\n", fForward? "yes": "no" );
//    Abc_Print( -2, "\t-b     : toggle backward retiming (for AIGs) [default = %s]\n", fBackward? "yes": "no" );
//    Abc_Print( -2, "\t-i     : toggle computation of initial state [default = %s]\n", fInitial? "yes": "no" );
}